

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtracer-inl.h
# Opt level: O2

void __thiscall
spdlog::details::backtracer::foreach_pop
          (backtracer *this,function<void_(const_spdlog::details::log_msg_&)> *fun)

{
  ulong uVar1;
  
  std::mutex::lock(&this->mutex_);
  uVar1 = (this->messages_).head_;
  while ((this->messages_).tail_ != uVar1) {
    std::function<void_(const_spdlog::details::log_msg_&)>::operator()
              (fun,&(this->messages_).v_.
                    super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar1].super_log_msg);
    uVar1 = ((this->messages_).head_ + 1) % (this->messages_).max_items_;
    (this->messages_).head_ = uVar1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

SPDLOG_INLINE void backtracer::foreach_pop(std::function<void(const details::log_msg &)> fun)
{
    std::lock_guard<std::mutex> lock{mutex_};
    while (!messages_.empty())
    {
        auto &front_msg = messages_.front();
        fun(front_msg);
        messages_.pop_front();
    }
}